

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_PC_BrDeleteExplicitLastPass_Test::TestBody
          (InterpreterTestSuite_PC_BrDeleteExplicitLastPass_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type sVar3;
  pointer pDVar4;
  pointer pNVar5;
  pointer pcVar6;
  _Alloc_hider _Var7;
  Registry *pRVar8;
  bool bVar9;
  Status SVar10;
  char *pcVar11;
  Status local_46a;
  Status local_469;
  string local_468;
  DomainArray doms;
  NetworkArray nwks;
  string local_408;
  internal local_3e8 [8];
  pointer local_3e0;
  string local_3d8;
  BorderRouterArray bra;
  undefined1 local_3a0 [16];
  _Alloc_hider local_390;
  char local_380 [16];
  string local_370;
  State local_350;
  State local_34c;
  undefined1 local_348 [32];
  ByteArray local_328;
  undefined1 local_310 [24];
  char local_2f8 [16];
  undefined1 local_2e8 [16];
  Value value;
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  bra.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testing::internal::CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
            ((internal *)&value,"ctx.mRegistry","nullptr",&ctx.mRegistry,(void **)&bra);
  _Var7 = value.mError.mMessage._M_dataplus;
  if ((undefined1)value.mError.mCode == kNone) {
    testing::Message::Message((Message *)&bra);
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) {
      pcVar11 = "";
    }
    else {
      pcVar11 = *(char **)value.mError.mMessage._M_dataplus._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&nwks,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xa66,pcVar11);
    testing::internal::AssertHelper::operator=((AssertHelper *)&nwks,(Message *)&bra);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwks);
    if (bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(bra.
         super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
         ._M_impl.super__Vector_impl_data._M_start)->_vptr_BorderRouter[1])();
    }
    local_3e0 = value.mError.mMessage._M_dataplus._M_p;
    if (value.mError.mMessage._M_dataplus._M_p == (pointer)0x0) goto LAB_00194618;
    if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*value.mError.mMessage._M_dataplus._M_p);
    }
  }
  else {
    if (value.mError.mMessage._M_dataplus._M_p != (pointer)0x0) {
      if (*value.mError.mMessage._M_dataplus._M_p != value.mError.mMessage._M_dataplus._M_p + 0x10)
      {
        operator_delete(*value.mError.mMessage._M_dataplus._M_p);
      }
      operator_delete(_Var7._M_p);
    }
    pRVar8 = ctx.mRegistry;
    bra.
    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&bra.
                   super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&bra,"127.0.0.1","");
    local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nwks.
    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&nwks.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&nwks,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_34c,0,0,0,0,0);
    local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"net1","");
    doms.
    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&doms.
                   super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&doms,"");
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"");
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"");
    local_348._0_8_ = (pointer)0x0;
    local_348._8_8_ = (pointer)0x0;
    local_348._16_8_ = (pointer)0x0;
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"domain1","");
    local_310._8_8_ = local_2f8;
    pcVar11 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_310 + 8),"","");
    ot::commissioner::UnixTime::UnixTime((UnixTime *)(local_2e8 + 8),0);
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)&value,(string *)&bra,0x4e21,&local_328,(string *)&nwks,local_34c,
               &local_3d8,1,(string *)&doms,&local_468,(Timestamp)0x0,0,&local_408,
               (ByteArray *)local_348,&local_370,'\0',0,(string *)(local_310 + 8),
               (UnixTime)local_2e8._8_8_,0x103f);
    local_469 = ot::commissioner::persistent_storage::Registry::Add(pRVar8,(BorderAgent *)&value);
    local_46a = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              (local_3e8,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
               ,"RegistryStatus::kSuccess",&local_469,&local_46a);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
    if ((char *)local_310._8_8_ != local_2f8) {
      operator_delete((void *)local_310._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p);
    }
    if ((pointer)local_348._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_348._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p);
    }
    if (doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&doms.
                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(doms.
                      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
      operator_delete(local_3d8._M_dataplus._M_p);
    }
    if (nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&nwks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(nwks.
                      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&bra.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(bra.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    pcVar6 = local_3e0;
    if (local_3e8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&value);
      if (local_3e0 != (pointer)0x0) {
        pcVar11 = *(char **)local_3e0;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bra,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xa6a,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
      if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
      }
      if (local_3e0 == (pointer)0x0) goto LAB_00194618;
      if (*(pointer *)local_3e0 != local_3e0 + 0x10) {
        operator_delete(*(pointer *)local_3e0);
      }
    }
    else {
      if (local_3e0 != (pointer)0x0) {
        if (*(pointer *)local_3e0 != local_3e0 + 0x10) {
          operator_delete(*(pointer *)local_3e0);
        }
        operator_delete(pcVar6);
      }
      pRVar8 = ctx.mRegistry;
      bra.
      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&bra.
                     super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&bra,"127.0.0.2","");
      local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nwks.
      super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&nwks.
                     super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&nwks,"1.1","");
      ot::commissioner::BorderAgent::State::State(&local_350,0,0,0,0,0);
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"net2","");
      doms.
      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&doms.
                     super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>((string *)&doms,"");
      local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"");
      local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"");
      local_348._0_8_ = (pointer)0x0;
      local_348._8_8_ = (pointer)0x0;
      local_348._16_8_ = (pointer)0x0;
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"domain2","");
      local_310._8_8_ = local_2f8;
      local_310._0_8_ = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_310 + 8));
      ot::commissioner::UnixTime::UnixTime((UnixTime *)local_2e8,0);
      pcVar11 = (char *)(ulong)(uint)local_350;
      ot::commissioner::BorderAgent::BorderAgent
                ((BorderAgent *)&value,(string *)&bra,0x4e22,&local_328,(string *)&nwks,local_350,
                 &local_3d8,2,(string *)&doms,&local_468,(Timestamp)0x0,0,&local_408,
                 (ByteArray *)local_348,&local_370,'\0',0,(string *)(local_310 + 8),
                 (UnixTime)local_2e8._0_8_,0x103f);
      local_469 = ot::commissioner::persistent_storage::Registry::Add(pRVar8,(BorderAgent *)&value);
      local_46a = kSuccess;
      testing::internal::
      CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                (local_3e8,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x3F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_469,&local_46a);
      ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)&value);
      if ((char *)local_310._8_8_ != local_2f8) {
        operator_delete((void *)local_310._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p);
      }
      if ((pointer)local_348._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_348._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468._M_dataplus._M_p != &local_468.field_2) {
        operator_delete(local_468._M_dataplus._M_p);
      }
      if (doms.
          super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&doms.
                    super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(doms.
                        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p);
      }
      if (nwks.
          super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&nwks.
                    super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(nwks.
                        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_328.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (bra.
          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pointer)&bra.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        operator_delete(bra.
                        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_3e8[0] != (internal)0x0) {
        if (local_3e0 != (pointer)0x0) {
          if (*(pointer *)local_3e0 != local_3e0 + 0x10) {
            operator_delete(*(pointer *)local_3e0);
          }
          operator_delete(local_3e0);
        }
        local_3d8.field_2._0_8_ = (pointer)0x0;
        local_3d8._M_dataplus._M_p = (pointer)0x0;
        local_3d8._M_string_length = 0;
        paVar1 = &value.mError.mMessage.field_2;
        value.mError.mCode = kNone;
        value.mError.mMessage._M_string_length = 0;
        value.mError.mMessage.field_2._M_local_buf[0] = '\0';
        paVar2 = &value.mData.field_2;
        value.mData._M_string_length = 0;
        value.mData.field_2._M_local_buf[0] = '\0';
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&bra.
                       super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
        value.mError.mMessage._M_dataplus._M_p = (pointer)paVar1;
        value.mData._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&bra,"br delete 1","");
        ot::commissioner::Interpreter::ParseExpression
                  ((Expression *)&doms,&ctx.mInterpreter,(string *)&bra);
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3d8.field_2._0_8_;
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3d8._M_string_length;
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3d8._M_dataplus._M_p;
        local_3d8.field_2._0_8_ =
             doms.
             super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_3d8._M_dataplus._M_p =
             (pointer)doms.
                      super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_3d8._M_string_length =
             (size_type)
             doms.
             super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&nwks);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&doms);
        if (bra.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&bra.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(bra.
                          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        ot::commissioner::Interpreter::Eval
                  ((Value *)&bra,&ctx.mInterpreter,(Expression *)&local_3d8);
        value.mError.mCode =
             (ErrorCode)
             bra.
             super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
             ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::operator=
                  ((string *)&value.mError.mMessage,
                   (string *)
                   &bra.
                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::operator=((string *)&value.mData,(string *)&local_390);
        if (local_390._M_p != local_380) {
          operator_delete(local_390._M_p);
        }
        if (bra.
            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)local_3a0) {
          operator_delete(bra.
                          super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
        }
        bVar9 = ot::commissioner::Interpreter::Value::HasNoError(&value);
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(nwks.
                               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar9);
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (!bVar9) {
          testing::Message::Message((Message *)&doms);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&bra,(internal *)&nwks,(AssertionResult *)0x2ddeee,"false","true",
                     pcVar11);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa75,(char *)bra.
                                    super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_468,(Message *)&doms);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
          if (bra.
              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              (pointer)&bra.
                        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(bra.
                            super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)doms.
                                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
          pNVar5 = nwks.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (nwks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
            if ((size_type *)
                *(undefined1 **)
                 nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish !=
                &((nwks.
                   super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->mName)._M_string_length) {
              operator_delete(*(undefined1 **)
                               nwks.
                               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
            }
            operator_delete(pNVar5);
          }
        }
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bra.
        super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SVar10 = ot::commissioner::persistent_storage::Registry::GetAllBorderRouters
                           (ctx.mRegistry,&bra);
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(doms.
                               super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,SVar10);
        local_468._M_dataplus._M_p = local_468._M_dataplus._M_p & 0xffffffffffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&nwks,"ctx.mRegistry->GetAllBorderRouters(bra)",
                   "RegistryStatus::kSuccess",(Status *)&doms,(Status *)&local_468);
        if ((char)nwks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&doms);
          if (nwks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)nwks.
                                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa77,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_468,(Message *)&doms);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)doms.
                                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        pNVar5 = nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (nwks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          if ((size_type *)
              *(undefined1 **)
               nwks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
              &((nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->mName)._M_string_length) {
            operator_delete(*(undefined1 **)
                             nwks.
                             super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          }
          operator_delete(pNVar5);
        }
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(((long)bra.
                              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)bra.
                              super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x7d6343eb1a1f58d1);
        local_468._M_dataplus._M_p._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&nwks,"bra.size()","1",(unsigned_long *)&doms,(int *)&local_468);
        if ((char)nwks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&doms);
          if (nwks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)nwks.
                                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa78,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_468,(Message *)&doms);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)doms.
                                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        pNVar5 = nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (nwks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          if ((size_type *)
              *(undefined1 **)
               nwks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
              &((nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->mName)._M_string_length) {
            operator_delete(*(undefined1 **)
                             nwks.
                             super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          }
          operator_delete(pNVar5);
        }
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((ulong)doms.
                              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  ((internal *)&nwks,"bra[0].mId.mId","0",
                   &((bra.
                      super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                      ._M_impl.super__Vector_impl_data._M_start)->mId).mId,(int *)&doms);
        if ((char)nwks.
                  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&doms);
          if (nwks.
              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)nwks.
                                super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_468,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa79,pcVar11);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_468,(Message *)&doms);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_468);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            (**(code **)(*(long *)doms.
                                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))();
          }
        }
        pNVar5 = nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (nwks.
            super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          if ((size_type *)
              *(undefined1 **)
               nwks.
               super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
              &((nwks.
                 super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->mName)._M_string_length) {
            operator_delete(*(undefined1 **)
                             nwks.
                             super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          }
          operator_delete(pNVar5);
        }
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        nwks.
        super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SVar10 = ot::commissioner::persistent_storage::Registry::GetAllNetworks(ctx.mRegistry,&nwks)
        ;
        local_468._M_dataplus._M_p._0_1_ = SVar10;
        local_408._M_dataplus._M_p = local_408._M_dataplus._M_p & 0xffffffffffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&doms,"ctx.mRegistry->GetAllNetworks(nwks)",
                   "RegistryStatus::kSuccess",(Status *)&local_468,(Status *)&local_408);
        if ((char)doms.
                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&local_468);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)doms.
                                super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_408,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa7c,pcVar11);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_408,(Message *)&local_468);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_408);
          if ((long *)local_468._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_468._M_dataplus._M_p + 8))();
          }
        }
        pDVar4 = doms.
                 super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (doms.
            super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          if ((size_type *)
              *(undefined1 **)
               doms.
               super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
              &((doms.
                 super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->mName)._M_string_length) {
            operator_delete(*(undefined1 **)
                             doms.
                             super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          }
          operator_delete(pDVar4);
        }
        local_468._M_dataplus._M_p =
             (pointer)(((long)nwks.
                              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)nwks.
                              super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555)
        ;
        local_408._M_dataplus._M_p._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&doms,"nwks.size()","1",(unsigned_long *)&local_468,(int *)&local_408
                  );
        if ((char)doms.
                  super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
          testing::Message::Message((Message *)&local_468);
          if (doms.
              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
              ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)doms.
                                super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_408,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa7d,pcVar11);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_408,(Message *)&local_468);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_408);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_468._M_dataplus._M_p + 8))();
          }
        }
        pDVar4 = doms.
                 super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (doms.
            super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          if ((size_type *)
              *(undefined1 **)
               doms.
               super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
               ._M_impl.super__Vector_impl_data._M_finish !=
              &((doms.
                 super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->mName)._M_string_length) {
            operator_delete(*(undefined1 **)
                             doms.
                             super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          }
          operator_delete(pDVar4);
        }
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        doms.
        super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        SVar10 = ot::commissioner::persistent_storage::Registry::GetAllDomains(ctx.mRegistry,&doms);
        local_408._M_dataplus._M_p._0_1_ = SVar10;
        local_370._M_dataplus._M_p = local_370._M_dataplus._M_p & 0xffffffffffffff00;
        testing::internal::
        CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
                  ((internal *)&local_468,"ctx.mRegistry->GetAllDomains(doms)",
                   "RegistryStatus::kSuccess",(Status *)&local_408,(Status *)&local_370);
        if ((Status)local_468._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_408);
          if ((undefined8 *)local_468._M_string_length == (undefined8 *)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)local_468._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_370,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa80,pcVar11);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_370,(Message *)&local_408);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_370);
          if ((long *)local_408._M_dataplus._M_p != (long *)0x0) {
            (**(code **)(*(long *)local_408._M_dataplus._M_p + 8))();
          }
        }
        sVar3 = local_468._M_string_length;
        if ((undefined8 *)local_468._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_468._M_string_length !=
              (undefined8 *)(local_468._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_468._M_string_length);
          }
          operator_delete((void *)sVar3);
        }
        local_408._M_dataplus._M_p =
             (pointer)(((long)doms.
                              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)doms.
                              super__Vector_base<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)
        ;
        local_370._M_dataplus._M_p._0_4_ = 1;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&local_468,"doms.size()","1",(unsigned_long *)&local_408,
                   (int *)&local_370);
        if ((Status)local_468._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_408);
          if ((undefined8 *)local_468._M_string_length == (undefined8 *)0x0) {
            pcVar11 = "";
          }
          else {
            pcVar11 = *(char **)local_468._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_370,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xa81,pcVar11);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_370,(Message *)&local_408);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_370);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_408._M_dataplus._M_p + 8))();
          }
        }
        if ((undefined8 *)local_468._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_468._M_string_length !=
              (undefined8 *)(local_468._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_468._M_string_length);
          }
          operator_delete((void *)local_468._M_string_length);
        }
        std::
        vector<ot::commissioner::persistent_storage::Domain,_std::allocator<ot::commissioner::persistent_storage::Domain>_>
        ::~vector(&doms);
        std::
        vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
        ::~vector(&nwks);
        std::
        vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
        ::~vector(&bra);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value.mData._M_dataplus._M_p != paVar2) {
          operator_delete(value.mData._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)value.mError.mMessage._M_dataplus._M_p != paVar1) {
          operator_delete(value.mError.mMessage._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_3d8);
        goto LAB_00194618;
      }
      testing::Message::Message((Message *)&value);
      if (local_3e0 != (pointer)0x0) {
        local_310._0_8_ = *(undefined8 *)local_3e0;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&bra,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xa6e,(char *)local_310._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&bra,(Message *)&value);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bra);
      if ((long *)CONCAT44(value.mError._4_4_,value.mError.mCode) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(value.mError._4_4_,value.mError.mCode) + 8))();
      }
      if (local_3e0 == (pointer)0x0) goto LAB_00194618;
      if (*(pointer *)local_3e0 != local_3e0 + 0x10) {
        operator_delete(*(pointer *)local_3e0);
      }
    }
  }
  operator_delete(local_3e0);
LAB_00194618:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrDeleteExplicitLastPass)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x3F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("br delete 1");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    BorderRouterArray bra;
    EXPECT_EQ(ctx.mRegistry->GetAllBorderRouters(bra), RegistryStatus::kSuccess);
    EXPECT_EQ(bra.size(), 1);
    EXPECT_EQ(bra[0].mId.mId, 0);

    NetworkArray nwks;
    EXPECT_EQ(ctx.mRegistry->GetAllNetworks(nwks), RegistryStatus::kSuccess);
    EXPECT_EQ(nwks.size(), 1);

    DomainArray doms;
    EXPECT_EQ(ctx.mRegistry->GetAllDomains(doms), RegistryStatus::kSuccess);
    EXPECT_EQ(doms.size(), 1);
}